

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# levenshtein_distance.cc
# Opt level: O0

int __thiscall
StrSimilar::FindSimilar
          (StrSimilar *this,string *str,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *list,string *result)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  ostream *poVar5;
  ostream *poVar6;
  size_type sVar7;
  const_reference pvVar8;
  string *in_RCX;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDX;
  string *in_stack_00000038;
  string *in_stack_00000040;
  StrSimilar *in_stack_00000048;
  int dis;
  int i;
  int min_dis;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffe70;
  string *in_stack_fffffffffffffed8;
  undefined8 in_stack_fffffffffffffee0;
  string *in_stack_fffffffffffffee8;
  undefined8 in_stack_fffffffffffffef0;
  LogSeverity severity;
  int local_dc;
  int local_d8;
  allocator local_d1;
  string local_d0 [39];
  allocator local_a9;
  string local_a8 [32];
  Logger local_88;
  allocator local_81;
  string local_80 [55];
  allocator local_49;
  string local_48 [36];
  Logger local_24;
  string *local_20;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_18;
  
  severity = (LogSeverity)((ulong)in_stack_fffffffffffffef0 >> 0x20);
  iVar3 = (int)((ulong)in_stack_fffffffffffffee0 >> 0x20);
  local_20 = in_RCX;
  local_18 = in_RDX;
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) != 0) {
    Logger::Logger(&local_24,ERR);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_48,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/base/levenshtein_distance.cc"
               ,&local_49);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_80,"FindSimilar",&local_81);
    poVar5 = Logger::Start(severity,in_stack_fffffffffffffee8,iVar3,in_stack_fffffffffffffed8);
    poVar5 = std::operator<<(poVar5,"CHECK failed ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/base/levenshtein_distance.cc"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x2e);
    poVar5 = std::operator<<(poVar5,"\n");
    poVar5 = std::operator<<(poVar5,"!str.empty()");
    poVar5 = std::operator<<(poVar5," = ");
    bVar1 = std::__cxx11::string::empty();
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,(bool)(bVar1 ^ 1));
    std::operator<<(poVar5,"\n");
    std::__cxx11::string::~string(local_80);
    std::allocator<char>::~allocator((allocator<char> *)&local_81);
    std::__cxx11::string::~string(local_48);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
    Logger::~Logger((Logger *)in_stack_fffffffffffffe70);
    abort();
  }
  bVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(in_stack_fffffffffffffe70);
  if (!bVar2) {
    local_d8 = 0x7fffffff;
    local_dc = 0;
    while( true ) {
      sVar7 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(local_18);
      if (sVar7 <= (ulong)(long)local_dc) break;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](local_18,(long)local_dc);
      iVar3 = ldistance(in_stack_00000048,in_stack_00000040,in_stack_00000038);
      if (iVar3 < local_d8) {
        pvVar8 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](local_18,(long)local_dc);
        std::__cxx11::string::operator=(local_20,(string *)pvVar8);
        local_d8 = iVar3;
      }
      local_dc = local_dc + 1;
    }
    return local_d8;
  }
  Logger::Logger(&local_88,ERR);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_a8,
             "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/base/levenshtein_distance.cc"
             ,&local_a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d0,"FindSimilar",&local_d1);
  poVar5 = Logger::Start(severity,in_stack_fffffffffffffee8,iVar3,in_stack_fffffffffffffed8);
  poVar5 = std::operator<<(poVar5,"CHECK failed ");
  poVar5 = std::operator<<(poVar5,
                           "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/base/levenshtein_distance.cc"
                          );
  poVar5 = std::operator<<(poVar5,":");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x2f);
  poVar5 = std::operator<<(poVar5,"\n");
  poVar5 = std::operator<<(poVar5,"!list.empty()");
  poVar5 = std::operator<<(poVar5," = ");
  bVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)poVar5);
  poVar6 = (ostream *)std::ostream::operator<<(poVar5,!bVar2);
  std::operator<<(poVar6,"\n");
  std::__cxx11::string::~string(local_d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_d1);
  std::__cxx11::string::~string(local_a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  Logger::~Logger((Logger *)poVar5);
  abort();
}

Assistant:

int StrSimilar::FindSimilar(const std::string& str,
                            const std::vector<std::string>& list,
                            std::string& result) {
  CHECK(!str.empty());
  CHECK(!list.empty());
  int min_dis = kInt32Max;
  for (int i = 0; i < list.size(); ++i) {
    int dis = ldistance(str, list[i]);
    if (dis < min_dis) {
      min_dis = dis;
      result = list[i];
    }
  }
  return min_dis;
}